

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O3

void __thiscall S2Builder::AddEdgeCrossings(S2Builder *this,MutableS2ShapeIndex *input_edge_index)

{
  S2Point *pSVar1;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *__range2;
  iterator __begin2;
  S2Point *v;
  iterator __end2;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> new_vertices;
  S2Point *local_58;
  S2Point *pSStack_50;
  undefined8 local_48;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  local_38._M_unused._M_object = &local_58;
  local_58 = (S2Point *)0x0;
  pSStack_50 = (S2Point *)0x0;
  local_48 = 0;
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<bool_(const_s2shapeutil::ShapeEdge_&,_const_s2shapeutil::ShapeEdge_&,_bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder.cc:616:7)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<bool_(const_s2shapeutil::ShapeEdge_&,_const_s2shapeutil::ShapeEdge_&,_bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder.cc:616:7)>
             ::_M_manager;
  s2shapeutil::VisitCrossingEdgePairs
            (&input_edge_index->super_S2ShapeIndex,INTERIOR,(EdgePairVisitor *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  pSVar1 = pSStack_50;
  if (local_58 != pSStack_50) {
    this->snapping_needed_ = true;
    v = local_58;
    do {
      AddVertex(this,v);
      v = v + 1;
    } while (v != pSVar1);
  }
  if (local_58 != (S2Point *)0x0) {
    operator_delete(local_58);
  }
  return;
}

Assistant:

void S2Builder::AddEdgeCrossings(const MutableS2ShapeIndex& input_edge_index) {
  // We need to build a list of intersections and add them afterwards so that
  // we don't reallocate vertices_ during the VisitCrossings() call.
  vector<S2Point> new_vertices;
  s2shapeutil::VisitCrossingEdgePairs(
      input_edge_index, s2shapeutil::CrossingType::INTERIOR,
      [&new_vertices](const s2shapeutil::ShapeEdge& a,
                      const s2shapeutil::ShapeEdge& b, bool) {
        new_vertices.push_back(
            S2::GetIntersection(a.v0(), a.v1(), b.v0(), b.v1()));
        return true;  // Continue visiting.
      });
  if (!new_vertices.empty()) {
    snapping_needed_ = true;
    for (const auto& vertex : new_vertices) AddVertex(vertex);
  }
}